

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma,
          SmallVectorBase<slang::parsing::Token> *skippedTokens)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  bool bVar1;
  PragmaDirectiveSyntax *in_RDI;
  string_view sVar2;
  SourceRange range;
  PragmaDirectiveSyntax *in_stack_00000018;
  Preprocessor *in_stack_00000020;
  string_view name;
  PragmaDirectiveSyntax *in_stack_00000148;
  Preprocessor *in_stack_00000150;
  Preprocessor *in_stack_ffffffffffffff10;
  Preprocessor *in_stack_ffffffffffffff18;
  Token *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  DiagCode code;
  basic_string_view<char,_std::char_traits<char>_> in_stack_ffffffffffffff38;
  Diagnostic *this_00;
  string_view in_stack_ffffffffffffff58;
  PragmaDirectiveSyntax *in_stack_ffffffffffffff80;
  Preprocessor *this_01;
  SmallVectorBase<slang::parsing::Token> *skippedTokens_00;
  
  sVar2 = Token::valueText(in_stack_ffffffffffffff20);
  skippedTokens_00 = (SmallVectorBase<slang::parsing::Token> *)sVar2._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
             (char *)in_stack_ffffffffffffff18);
  __y._M_str._0_4_ = in_stack_ffffffffffffff30;
  __y._M_len = in_stack_ffffffffffffff28;
  __y._M_str._4_4_ = in_stack_ffffffffffffff34;
  bVar1 = std::operator==(in_stack_ffffffffffffff38,__y);
  if (bVar1) {
    applyProtectPragma((Preprocessor *)sVar2._M_str,(PragmaDirectiveSyntax *)sVar2._M_len,
                       skippedTokens_00);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
               (char *)in_stack_ffffffffffffff18);
    __y_00._M_str._0_4_ = in_stack_ffffffffffffff30;
    __y_00._M_len = in_stack_ffffffffffffff28;
    __y_00._M_str._4_4_ = in_stack_ffffffffffffff34;
    bVar1 = std::operator==(in_stack_ffffffffffffff38,__y_00);
    this_00 = (Diagnostic *)sVar2._M_str;
    if (bVar1) {
      applyResetPragma(in_stack_00000020,in_stack_00000018);
    }
    else {
      this_01 = (Preprocessor *)sVar2._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
                 (char *)in_stack_ffffffffffffff18);
      __y_01._M_str._0_4_ = in_stack_ffffffffffffff30;
      __y_01._M_len = in_stack_ffffffffffffff28;
      __y_01._M_str._4_4_ = in_stack_ffffffffffffff34;
      bVar1 = std::operator==(in_stack_ffffffffffffff38,__y_01);
      if (bVar1) {
        applyResetAllPragma(in_stack_ffffffffffffff10,in_RDI);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
                   (char *)in_stack_ffffffffffffff18);
        __y_02._M_str._0_4_ = in_stack_ffffffffffffff30;
        __y_02._M_len = in_stack_ffffffffffffff28;
        __y_02._M_str._4_4_ = in_stack_ffffffffffffff34;
        bVar1 = std::operator==(in_stack_ffffffffffffff38,__y_02);
        if (bVar1) {
          applyOncePragma(this_01,in_stack_ffffffffffffff80);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff20,
                     (char *)in_stack_ffffffffffffff18);
          __y_03._M_str._0_4_ = in_stack_ffffffffffffff30;
          __y_03._M_len = in_stack_ffffffffffffff28;
          __y_03._M_str._4_4_ = in_stack_ffffffffffffff34;
          bVar1 = std::operator==(in_stack_ffffffffffffff38,__y_03);
          if (bVar1) {
            applyDiagnosticPragma(in_stack_00000150,in_stack_00000148);
          }
          else {
            code.subsystem = Preprocessor;
            code.code = 0x2b;
            range = Token::range((Token *)CONCAT44(0x2b0004,in_stack_ffffffffffffff30));
            addDiag(in_stack_ffffffffffffff18,code,range);
            Diagnostic::operator<<(this_00,in_stack_ffffffffffffff58);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Preprocessor::applyPragma(const PragmaDirectiveSyntax& pragma,
                               SmallVectorBase<Token>& skippedTokens) {
    std::string_view name = pragma.name.valueText();
    if (name == "protect") {
        applyProtectPragma(pragma, skippedTokens);
        return;
    }

    if (name == "reset") {
        applyResetPragma(pragma);
        return;
    }

    if (name == "resetall") {
        applyResetAllPragma(pragma);
        return;
    }

    if (name == "once") {
        applyOncePragma(pragma);
        return;
    }

    if (name == "diagnostic") {
        applyDiagnosticPragma(pragma);
        return;
    }

    // Otherwise, if the pragma is unknown warn and ignore.
    addDiag(diag::UnknownPragma, pragma.name.range()) << name;
}